

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__zbuild_huffman(stbi__zhuffman *z,stbi_uc *sizelist,int num)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int sizes [17];
  int next_code [16];
  undefined1 local_c8 [64];
  undefined4 local_88;
  int aiStack_78 [18];
  
  local_88 = 0;
  local_c8 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  memset(z,0,0x400);
  if (0 < num) {
    uVar5 = 0;
    do {
      pbVar1 = sizelist + uVar5;
      uVar5 = uVar5 + 1;
      *(int *)(local_c8 + (ulong)*pbVar1 * 4) = *(int *)(local_c8 + (ulong)*pbVar1 * 4) + 1;
    } while ((uint)num != uVar5);
  }
  lVar6 = 1;
  do {
    if (1 << ((uint)lVar6 & 0x1f) < *(int *)(local_c8 + lVar6 * 4)) {
      stbi__g_failure_reason = "bad sizes";
      return 0;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  uVar7 = 0xf;
  lVar6 = 0;
  iVar8 = 0;
  iVar9 = 0;
  while( true ) {
    aiStack_78[lVar6 + 1] = iVar9;
    z->firstcode[lVar6 + 1] = (stbi__uint16)iVar9;
    z->firstsymbol[lVar6 + 1] = (stbi__uint16)iVar8;
    iVar3 = *(int *)(local_c8 + lVar6 * 4 + 4);
    iVar10 = iVar9 + iVar3;
    if ((iVar3 != 0) && (1 << ((int)lVar6 + 1U & 0x1f) < iVar10)) break;
    uVar4 = uVar7 & 0x1f;
    iVar9 = iVar10 * 2;
    iVar8 = iVar8 + iVar3;
    uVar7 = uVar7 - 1;
    z->maxcode[lVar6 + 1] = iVar10 << uVar4;
    lVar6 = lVar6 + 1;
    if (lVar6 == 0xf) {
      z->maxcode[0x10] = 0x10000;
      if (0 < num) {
        vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
        vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
        vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar5 = 0;
        do {
          bVar2 = sizelist[uVar5];
          if (bVar2 != 0) {
            iVar9 = aiStack_78[bVar2];
            lVar6 = (long)(int)(iVar9 - (uint)z->firstcode[bVar2]) + (ulong)z->firstsymbol[bVar2];
            z->size[lVar6] = bVar2;
            z->value[lVar6] = (stbi__uint16)uVar5;
            if (bVar2 < 10) {
              halt_baddata();
            }
            aiStack_78[bVar2] = iVar9 + 1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)num);
      }
      return 1;
    }
  }
  stbi__g_failure_reason = "bad codelengths";
  return 0;
}

Assistant:

static int stbi__zbuild_huffman(stbi__zhuffman *z, const stbi_uc *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 0, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      if (sizes[i] > (1 << i))
         return stbi__err("bad sizes", "Corrupt PNG");
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (stbi__uint16) code;
      z->firstsymbol[i] = (stbi__uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return stbi__err("bad codelengths","Corrupt PNG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         stbi__uint16 fastv = (stbi__uint16) ((s << 9) | i);
         z->size [c] = (stbi_uc     ) s;
         z->value[c] = (stbi__uint16) i;
         if (s <= STBI__ZFAST_BITS) {
            int j = stbi__bit_reverse(next_code[s],s);
            while (j < (1 << STBI__ZFAST_BITS)) {
               z->fast[j] = fastv;
               j += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}